

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O1

bool __thiscall
brotli::BrotliCompressor::WriteMetadata
          (BrotliCompressor *this,size_t input_size,uint8_t *input_buffer,bool is_last,
          size_t *encoded_size,uint8_t *encoded_buffer)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  uint uVar7;
  uint64_t hdr_buffer_data [2];
  ulong local_48 [2];
  undefined4 local_34;
  
  if (0x1000000 < input_size) {
    return false;
  }
  uVar5 = 0;
  if (*encoded_size < input_size + 6) {
    return false;
  }
  bVar2 = this->last_byte_bits_;
  uVar7 = (uint)bVar2;
  local_48[0]._0_1_ = this->last_byte_;
  *(ulong *)((long)local_48 + (ulong)(bVar2 >> 3)) =
       (ulong)*(byte *)((long)local_48 + (ulong)(bVar2 >> 3));
  uVar6 = (ulong)(uVar7 + 1 >> 3);
  *(ulong *)((long)local_48 + uVar6) =
       3L << ((byte)(uVar7 + 1) & 7) | (ulong)*(byte *)((long)local_48 + uVar6);
  uVar6 = (ulong)(bVar2 + 3 >> 3);
  *(ulong *)((long)local_48 + uVar6) = (ulong)*(byte *)((long)local_48 + uVar6);
  uVar1 = uVar7 + 4;
  if (input_size != 1) {
    if (input_size == 0) {
      *(ulong *)((long)local_48 + (ulong)(uVar1 >> 3)) =
           (ulong)*(byte *)((long)local_48 + (ulong)(uVar1 >> 3));
      uVar6 = (ulong)(uVar7 + 0xd >> 3);
      *encoded_size = uVar6;
      memcpy(encoded_buffer,local_48,uVar6);
      goto LAB_00181e3e;
    }
    uVar4 = (int)input_size - 1;
    uVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x28 >> 3;
  }
  if (uVar5 < 4) {
    local_34 = (int)CONCAT71(in_register_00000009,is_last);
    *(ulong *)((long)local_48 + (ulong)(uVar1 >> 3)) =
         (ulong)uVar5 << ((byte)uVar1 & 7) | (ulong)*(byte *)((long)local_48 + (ulong)(uVar1 >> 3));
    if (input_size - 1 >> ((byte)(uVar5 * 8) & 0x3f) == 0) {
      uVar6 = (ulong)(uVar7 + 6 >> 3);
      *(size_t *)((long)local_48 + uVar6) =
           input_size - 1 << ((byte)(uVar7 + 6) & 7) | (ulong)*(byte *)((long)local_48 + uVar6);
      uVar6 = (ulong)(uVar7 + uVar5 * 8 + 0xd >> 3);
      memcpy(encoded_buffer,local_48,uVar6);
      memcpy(encoded_buffer + uVar6,input_buffer,input_size);
      *encoded_size = uVar6 + input_size;
      is_last = SUB41(local_34,0);
LAB_00181e3e:
      if (is_last != false) {
        sVar3 = *encoded_size;
        *encoded_size = sVar3 + 1;
        encoded_buffer[sVar3] = '\x03';
      }
      this->last_byte_ = '\0';
      this->last_byte_bits_ = '\0';
      return true;
    }
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                ,0x2c,
                "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)")
  ;
}

Assistant:

bool BrotliCompressor::WriteMetadata(const size_t input_size,
                                     const uint8_t* input_buffer,
                                     const bool is_last,
                                     size_t* encoded_size,
                                     uint8_t* encoded_buffer) {
  if (input_size > (1 << 24) || input_size + 6 > *encoded_size) {
    return false;
  }
  uint64_t hdr_buffer_data[2];
  uint8_t* hdr_buffer = reinterpret_cast<uint8_t*>(&hdr_buffer_data[0]);
  size_t storage_ix = last_byte_bits_;
  hdr_buffer[0] = last_byte_;
  WriteBits(1, 0, &storage_ix, hdr_buffer);
  WriteBits(2, 3, &storage_ix, hdr_buffer);
  WriteBits(1, 0, &storage_ix, hdr_buffer);
  if (input_size == 0) {
    WriteBits(2, 0, &storage_ix, hdr_buffer);
    *encoded_size = (storage_ix + 7u) >> 3;
    memcpy(encoded_buffer, hdr_buffer, *encoded_size);
  } else {
    uint32_t nbits = (input_size == 1) ? 0 : (Log2FloorNonZero(
        static_cast<uint32_t>(input_size) - 1) + 1);
    uint32_t nbytes = (nbits + 7) / 8;
    WriteBits(2, nbytes, &storage_ix, hdr_buffer);
    WriteBits(8 * nbytes, input_size - 1, &storage_ix, hdr_buffer);
    size_t hdr_size = (storage_ix + 7u) >> 3;
    memcpy(encoded_buffer, hdr_buffer, hdr_size);
    memcpy(&encoded_buffer[hdr_size], input_buffer, input_size);
    *encoded_size = hdr_size + input_size;
  }
  if (is_last) {
    encoded_buffer[(*encoded_size)++] = 3;
  }
  last_byte_ = 0;
  last_byte_bits_ = 0;
  return true;
}